

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataset.cpp
# Opt level: O1

double __thiscall DataSet::biased(DataSet *this)

{
  pointer pdVar1;
  vector<double,_std::allocator<double>_> *pvVar2;
  uint index;
  ulong uVar3;
  double dVar4;
  double dVar5;
  
  dVar4 = min(this);
  dVar4 = 1.0 - dVar4;
  dVar5 = 0.0;
  if ((1.0 <= dVar4) && (dVar5 = dVar4, (this->m_matrix).m_shape.n_row != 0)) {
    index = 0;
    do {
      if ((this->m_matrix).m_shape.n_col != 1) {
        uVar3 = 0;
        do {
          pvVar2 = Matrix<double>::operator[](&this->m_matrix,index);
          pdVar1 = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar1[uVar3] = pdVar1[uVar3] + dVar4;
          uVar3 = uVar3 + 1;
        } while (uVar3 < (this->m_matrix).m_shape.n_col - 1);
      }
      index = index + 1;
    } while (index < (this->m_matrix).m_shape.n_row);
  }
  return dVar5;
}

Assistant:

double DataSet::biased(){
    double bias=-1*min(*this)+1;

    if(bias<1) return 0.;

    for(unsigned i=0;i<m_matrix.shape().n_row;++i){
        for(unsigned j=0;j<m_matrix.shape().n_col-1;++j)
            m_matrix[i][j]+=bias;
    }
    return bias;
}